

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O2

void __thiscall
btSpatialTransformationMatrix::transformInverse
          (btSpatialTransformationMatrix *this,btSymmetricSpatialDyad *inMat,
          btSymmetricSpatialDyad *outMat,eOutputOperation outOp)

{
  btMatrix3x3 *pbVar1;
  btMatrix3x3 local_240;
  btMatrix3x3 local_210;
  btMatrix3x3 local_1e0;
  btMatrix3x3 local_1b0;
  btMatrix3x3 local_180;
  btMatrix3x3 local_150;
  btMatrix3x3 local_120;
  btMatrix3x3 local_f0;
  btMatrix3x3 local_c0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  local_240.m_el[1].m_floats[0] = (this->m_trnVec).m_floats[2];
  local_240.m_el[0].m_floats[1] = -local_240.m_el[1].m_floats[0];
  local_240.m_el[2].m_floats[1] = (this->m_trnVec).m_floats[0];
  local_240.m_el[0].m_floats[2] = (this->m_trnVec).m_floats[1];
  local_240.m_el[1].m_floats[2] = -local_240.m_el[2].m_floats[1];
  local_240.m_el[0].m_floats[0] = 0.0;
  local_240.m_el[0].m_floats[3] = 0.0;
  local_240.m_el[1].m_floats[1] = 0.0;
  local_240.m_el[1].m_floats[3] = 0.0;
  local_240.m_el[2].m_floats[0] = -local_240.m_el[0].m_floats[2];
  local_240.m_el[2].m_floats[2] = 0.0;
  local_240.m_el[2].m_floats[3] = 0.0;
  if (outOp == Subtract) {
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    pbVar1 = &inMat->m_topRightMat;
    operator*(&local_150,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_150);
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator-=(&outMat->m_topLeftMat,&local_180);
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_1b0,&local_210,pbVar1);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator-=(&outMat->m_topRightMat,&local_180);
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_c0,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_c0);
    operator*(&local_60,&local_240,&local_90);
    operator+(&local_60,&inMat->m_bottomLeftMat);
    btMatrix3x3::transpose(&local_f0,&inMat->m_topLeftMat);
    operator*(&local_120,&local_f0,&local_240);
    local_1e0.m_el[0].m_floats[2] = local_150.m_el[0].m_floats[2] - local_120.m_el[0].m_floats[2];
    local_1e0.m_el[1].m_floats[2] = local_150.m_el[1].m_floats[2] - local_120.m_el[1].m_floats[2];
    local_1e0.m_el[2].m_floats[2] = local_150.m_el[2].m_floats[2] - local_120.m_el[2].m_floats[2];
    local_1e0.m_el[0].m_floats[0] = local_150.m_el[0].m_floats[0] - local_120.m_el[0].m_floats[0];
    local_1e0.m_el[0].m_floats[1] = local_150.m_el[0].m_floats[1] - local_120.m_el[0].m_floats[1];
    local_1e0.m_el[0].m_floats[3] = 0.0;
    local_1e0.m_el[1].m_floats[0] = local_150.m_el[1].m_floats[0] - local_120.m_el[1].m_floats[0];
    local_1e0.m_el[1].m_floats[1] = local_150.m_el[1].m_floats[1] - local_120.m_el[1].m_floats[1];
    local_1e0.m_el[1].m_floats[3] = 0.0;
    local_1e0.m_el[2].m_floats[0] = local_150.m_el[2].m_floats[0] - local_120.m_el[2].m_floats[0];
    local_1e0.m_el[2].m_floats[1] = local_150.m_el[2].m_floats[1] - local_120.m_el[2].m_floats[1];
    local_1e0.m_el[2].m_floats[3] = 0.0;
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator-=(&outMat->m_bottomLeftMat,&local_180);
  }
  else if (outOp == Add) {
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    pbVar1 = &inMat->m_topRightMat;
    operator*(&local_150,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_150);
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator+=(&outMat->m_topLeftMat,&local_180);
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_1b0,&local_210,pbVar1);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator+=(&outMat->m_topRightMat,&local_180);
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_c0,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_c0);
    operator*(&local_60,&local_240,&local_90);
    operator+(&local_60,&inMat->m_bottomLeftMat);
    btMatrix3x3::transpose(&local_f0,&inMat->m_topLeftMat);
    operator*(&local_120,&local_f0,&local_240);
    local_1e0.m_el[0].m_floats[2] = local_150.m_el[0].m_floats[2] - local_120.m_el[0].m_floats[2];
    local_1e0.m_el[1].m_floats[2] = local_150.m_el[1].m_floats[2] - local_120.m_el[1].m_floats[2];
    local_1e0.m_el[2].m_floats[2] = local_150.m_el[2].m_floats[2] - local_120.m_el[2].m_floats[2];
    local_1e0.m_el[0].m_floats[0] = local_150.m_el[0].m_floats[0] - local_120.m_el[0].m_floats[0];
    local_1e0.m_el[0].m_floats[1] = local_150.m_el[0].m_floats[1] - local_120.m_el[0].m_floats[1];
    local_1e0.m_el[0].m_floats[3] = 0.0;
    local_1e0.m_el[1].m_floats[0] = local_150.m_el[1].m_floats[0] - local_120.m_el[1].m_floats[0];
    local_1e0.m_el[1].m_floats[1] = local_150.m_el[1].m_floats[1] - local_120.m_el[1].m_floats[1];
    local_1e0.m_el[1].m_floats[3] = 0.0;
    local_1e0.m_el[2].m_floats[0] = local_150.m_el[2].m_floats[0] - local_120.m_el[2].m_floats[0];
    local_1e0.m_el[2].m_floats[1] = local_150.m_el[2].m_floats[1] - local_120.m_el[2].m_floats[1];
    local_1e0.m_el[2].m_floats[3] = 0.0;
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    btMatrix3x3::operator+=(&outMat->m_bottomLeftMat,&local_180);
  }
  else if (outOp == None) {
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    pbVar1 = &inMat->m_topRightMat;
    operator*(&local_150,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_150);
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    *(undefined8 *)(outMat->m_topLeftMat).m_el[0].m_floats = local_180.m_el[0].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topLeftMat).m_el[0].m_floats + 2) = local_180.m_el[0].m_floats._8_8_;
    *(undefined8 *)(outMat->m_topLeftMat).m_el[1].m_floats = local_180.m_el[1].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topLeftMat).m_el[1].m_floats + 2) = local_180.m_el[1].m_floats._8_8_;
    *(undefined8 *)(outMat->m_topLeftMat).m_el[2].m_floats = local_180.m_el[2].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topLeftMat).m_el[2].m_floats + 2) = local_180.m_el[2].m_floats._8_8_;
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_1b0,&local_210,pbVar1);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    *(undefined8 *)(outMat->m_topRightMat).m_el[0].m_floats = local_180.m_el[0].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topRightMat).m_el[0].m_floats + 2) = local_180.m_el[0].m_floats._8_8_
    ;
    *(undefined8 *)(outMat->m_topRightMat).m_el[1].m_floats = local_180.m_el[1].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topRightMat).m_el[1].m_floats + 2) = local_180.m_el[1].m_floats._8_8_
    ;
    *(undefined8 *)(outMat->m_topRightMat).m_el[2].m_floats = local_180.m_el[2].m_floats._0_8_;
    *(undefined8 *)((outMat->m_topRightMat).m_el[2].m_floats + 2) = local_180.m_el[2].m_floats._8_8_
    ;
    btMatrix3x3::transpose(&local_210,&this->m_rotMat);
    operator*(&local_c0,pbVar1,&local_240);
    operator-(&inMat->m_topLeftMat,&local_c0);
    operator*(&local_60,&local_240,&local_90);
    operator+(&local_60,&inMat->m_bottomLeftMat);
    btMatrix3x3::transpose(&local_f0,&inMat->m_topLeftMat);
    operator*(&local_120,&local_f0,&local_240);
    local_1e0.m_el[0].m_floats[2] = local_150.m_el[0].m_floats[2] - local_120.m_el[0].m_floats[2];
    local_1e0.m_el[1].m_floats[2] = local_150.m_el[1].m_floats[2] - local_120.m_el[1].m_floats[2];
    local_1e0.m_el[2].m_floats[2] = local_150.m_el[2].m_floats[2] - local_120.m_el[2].m_floats[2];
    local_1e0.m_el[0].m_floats[0] = local_150.m_el[0].m_floats[0] - local_120.m_el[0].m_floats[0];
    local_1e0.m_el[0].m_floats[1] = local_150.m_el[0].m_floats[1] - local_120.m_el[0].m_floats[1];
    local_1e0.m_el[0].m_floats[3] = 0.0;
    local_1e0.m_el[1].m_floats[0] = local_150.m_el[1].m_floats[0] - local_120.m_el[1].m_floats[0];
    local_1e0.m_el[1].m_floats[1] = local_150.m_el[1].m_floats[1] - local_120.m_el[1].m_floats[1];
    local_1e0.m_el[1].m_floats[3] = 0.0;
    local_1e0.m_el[2].m_floats[0] = local_150.m_el[2].m_floats[0] - local_120.m_el[2].m_floats[0];
    local_1e0.m_el[2].m_floats[1] = local_150.m_el[2].m_floats[1] - local_120.m_el[2].m_floats[1];
    local_1e0.m_el[2].m_floats[3] = 0.0;
    operator*(&local_1b0,&local_210,&local_1e0);
    operator*(&local_180,&local_1b0,&this->m_rotMat);
    *(undefined8 *)(outMat->m_bottomLeftMat).m_el[0].m_floats = local_180.m_el[0].m_floats._0_8_;
    *(undefined8 *)((outMat->m_bottomLeftMat).m_el[0].m_floats + 2) =
         local_180.m_el[0].m_floats._8_8_;
    *(undefined8 *)(outMat->m_bottomLeftMat).m_el[1].m_floats = local_180.m_el[1].m_floats._0_8_;
    *(undefined8 *)((outMat->m_bottomLeftMat).m_el[1].m_floats + 2) =
         local_180.m_el[1].m_floats._8_8_;
    *(undefined8 *)(outMat->m_bottomLeftMat).m_el[2].m_floats = local_180.m_el[2].m_floats._0_8_;
    *(undefined8 *)((outMat->m_bottomLeftMat).m_el[2].m_floats + 2) =
         local_180.m_el[2].m_floats._8_8_;
  }
  return;
}

Assistant:

void transformInverse(	const btSymmetricSpatialDyad &inMat,
							btSymmetricSpatialDyad &outMat,
							eOutputOperation outOp = None)
	{
		const btMatrix3x3 r_cross(	0, -m_trnVec[2], m_trnVec[1],
								m_trnVec[2], 0, -m_trnVec[0],
								-m_trnVec[1], m_trnVec[0], 0);


		if(outOp == None)
		{
			outMat.m_topLeftMat = m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat = m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat = m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Add)
		{
			outMat.m_topLeftMat += m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat += m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat += m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
		else if(outOp == Subtract)
		{
			outMat.m_topLeftMat -= m_rotMat.transpose() * ( inMat.m_topLeftMat - inMat.m_topRightMat * r_cross ) * m_rotMat;
			outMat.m_topRightMat -= m_rotMat.transpose() * inMat.m_topRightMat * m_rotMat;
			outMat.m_bottomLeftMat -= m_rotMat.transpose() * (r_cross * (inMat.m_topLeftMat - inMat.m_topRightMat * r_cross) + inMat.m_bottomLeftMat - inMat.m_topLeftMat.transpose() * r_cross) * m_rotMat;
		}
	}